

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O2

bool QFSFileEngine::setCurrentPath(QString *path)

{
  bool bVar1;
  long in_FS_OFFSET;
  QFileSystemEntry QStack_48;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  QFileSystemEntry::QFileSystemEntry(&QStack_48,path);
  bVar1 = QFileSystemEngine::setCurrentPath(&QStack_48);
  QFileSystemEntry::~QFileSystemEntry(&QStack_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QFSFileEngine::setCurrentPath(const QString &path)
{
    return QFileSystemEngine::setCurrentPath(QFileSystemEntry(path));
}